

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O2

void operator_release(op_type *op_pt)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  double dVar4;
  
  dVar4 = op_pt->amp;
  if (1e-08 < dVar4) {
    dVar4 = dVar4 * op_pt->releasemul;
    op_pt->amp = dVar4;
  }
  uVar1 = op_pt->generator_pos >> 0x10;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    uVar2 = op_pt->cur_env_step + 1;
    op_pt->cur_env_step = uVar2;
    if ((op_pt->env_step_r & uVar2) == 0) {
      if (dVar4 <= 1e-08) {
        op_pt->amp = 0.0;
        dVar4 = 0.0;
        if (op_pt->op_state == 2) {
          op_pt->op_state = 5;
        }
      }
      op_pt->step_amp = dVar4;
    }
  }
  op_pt->generator_pos = op_pt->generator_pos & 0xffff;
  return;
}

Assistant:

void operator_release(op_type* op_pt) {
	// ??? boundary?
	if (op_pt->amp > 0.00000001) {
		// release phase
		op_pt->amp *= op_pt->releasemul;
	}

	Bit32u num_steps_add = op_pt->generator_pos/FIXEDPT;	// number of (standardized) samples
	for (Bit32u ct=0; ct<num_steps_add; ct++) {
		op_pt->cur_env_step++;						// sample counter
		if ((op_pt->cur_env_step & op_pt->env_step_r)==0) {
			if (op_pt->amp <= 0.00000001) {
				// release phase finished, turn off this operator
				op_pt->amp = 0.0;
				if (op_pt->op_state == OF_TYPE_REL) {
					op_pt->op_state = OF_TYPE_OFF;
				}
			}
			op_pt->step_amp = op_pt->amp;
		}
	}
	op_pt->generator_pos -= num_steps_add*FIXEDPT;
}